

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onconnect.c
# Opt level: O3

int del_epoll(int fd)

{
  int iVar1;
  epoll_event ev;
  
  iVar1 = epoll_ctl(cfg.epoll_fd,2,fd,(epoll_event *)&stack0xffffffffffffffec);
  if (iVar1 == -1) {
    del_epoll_cold_1();
  }
  return iVar1;
}

Assistant:

int del_epoll(int fd) {
  int rc;
  struct epoll_event ev;
  rc = epoll_ctl(cfg.epoll_fd, EPOLL_CTL_DEL, fd, &ev);
  if (rc == -1) {
    fprintf(stderr,"epoll_ctl: %s\n", strerror(errno));
  }
  return rc;
}